

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O3

void rw::d3d9::writeNativeTexture(Texture *tex,Stream *stream)

{
  Raster *this;
  uint32 uVar1;
  int32 iVar2;
  uint val;
  uint8 *puVar3;
  uint8 uVar4;
  undefined8 uVar5;
  uint8 uVar6;
  int level;
  long lVar7;
  
  uVar1 = getSizeNativeTexture(tex);
  writeChunkHeader(stream,1,uVar1 - 0xc);
  Stream::writeU32(stream,9);
  Stream::writeU32(stream,tex->filterAddressing);
  (*stream->_vptr_Stream[3])(stream,tex->name,0x20);
  (*stream->_vptr_Stream[3])(stream,tex->mask,0x20);
  this = tex->raster;
  lVar7 = (long)d3d::nativeRasterOffset;
  iVar2 = Raster::getNumLevels(this);
  Stream::writeI32(stream,this->format);
  Stream::writeU32(stream,*(uint32 *)((long)&this->height + lVar7));
  Stream::writeU16(stream,(uint16)this->width);
  Stream::writeU16(stream,(uint16)this->height);
  Stream::writeU8(stream,(uint8)this->depth);
  Stream::writeU8(stream,(uint8)iVar2);
  Stream::writeU8(stream,(uint8)this->type);
  uVar6 = (uint8)*(undefined4 *)((long)&this->stride + lVar7);
  uVar4 = uVar6 + '\x04';
  if (*(char *)((long)&this->stride + lVar7 + 2) == '\0') {
    uVar4 = uVar6;
  }
  uVar6 = uVar4 + '\b';
  if (*(char *)((long)&this->stride + lVar7 + 1) == '\0') {
    uVar6 = uVar4;
  }
  Stream::writeU8(stream,uVar6);
  uVar5 = 0x80;
  if ((((uint)this->format >> 0xe & 1) != 0) ||
     (uVar5 = 0x400, ((uint)this->format >> 0xd & 1) != 0)) {
    (*stream->_vptr_Stream[3])(stream,*(undefined8 *)((long)&this->flags + lVar7),uVar5);
  }
  if (0 < iVar2) {
    level = 0;
    do {
      val = d3d::getLevelSize(this,level);
      Stream::writeU32(stream,val);
      puVar3 = Raster::lock(this,level,2);
      (*stream->_vptr_Stream[3])(stream,puVar3,(ulong)val);
      Raster::unlock(this,level);
      level = level + 1;
    } while (iVar2 != level);
  }
  return;
}

Assistant:

void
writeNativeTexture(Texture *tex, Stream *stream)
{
	int32 chunksize = getSizeNativeTexture(tex);
	writeChunkHeader(stream, ID_STRUCT, chunksize-12);
	stream->writeU32(PLATFORM_D3D9);

	// Texture
	stream->writeU32(tex->filterAddressing);
	stream->write8(tex->name, 32);
	stream->write8(tex->mask, 32);

	// Raster
	Raster *raster = tex->raster;
	D3dRaster *ext = GETD3DRASTEREXT(raster);
	int32 numLevels = raster->getNumLevels();
	stream->writeI32(raster->format);
	stream->writeU32(ext->format);
	stream->writeU16(raster->width);
	stream->writeU16(raster->height);
	stream->writeU8(raster->depth);
	stream->writeU8(numLevels);
	stream->writeU8(raster->type);
	uint8 flags = 0;
	if(ext->hasAlpha)
		flags |= 1;
	// no cube supported yet
	if(ext->autogenMipmap)
		flags |= 4;
	if(ext->customFormat)
		flags |= 8;
	stream->writeU8(flags);

	if(raster->format & Raster::PAL4)
		stream->write8(ext->palette, 4*32);
	else if(raster->format & Raster::PAL8)
		stream->write8(ext->palette, 4*256);

	uint32 size;
	uint8 *data;
	for(int32 i = 0; i < numLevels; i++){
		size = getLevelSize(raster, i);
		stream->writeU32(size);
		data = raster->lock(i, Raster::LOCKREAD);
		stream->write8(data, size);
		raster->unlock(i);
	}
}